

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O2

int Abc_NtkCollectSupergate_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst,int fStopAtMux)

{
  byte *pbVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *pNode_00;
  ulong uVar6;
  ulong uVar7;
  
  if ((*(byte *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0x20) == 0) {
    if (fFirst == 0) {
      if ((((((ulong)pNode & 1) != 0) || ((*(uint *)&pNode->field_0x14 & 0xf) != 7)) ||
          (1 < (pNode->vFanouts).nSize)) ||
         ((fStopAtMux != 0 && (iVar3 = Abc_NodeIsMuxType(pNode), iVar3 != 0)))) {
        Vec_PtrPush(vSuper,pNode);
        pbVar1 = (byte *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14);
        *pbVar1 = *pbVar1 | 0x20;
        return 0;
      }
    }
    else if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                    ,0x18e,"int Abc_NtkCollectSupergate_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                    ,399,"int Abc_NtkCollectSupergate_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
    }
    pNode_00 = Abc_ObjChild0(pNode);
    iVar3 = Abc_NtkCollectSupergate_rec(pNode_00,vSuper,0,fStopAtMux);
    iVar4 = Abc_NtkCollectSupergate_rec
                      ((Abc_Obj_t *)
                       ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
                       (ulong)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]),vSuper,0,
                       fStopAtMux);
    uVar5 = 0xffffffff;
    if ((iVar3 != -1) && (iVar4 != -1)) {
      uVar5 = (uint)(iVar3 != 0 || iVar4 != 0);
    }
  }
  else {
    uVar6 = (ulong)(uint)vSuper->nSize;
    if (vSuper->nSize < 1) {
      uVar6 = 0;
    }
    uVar5 = 1;
    uVar7 = 0;
    do {
      if (uVar6 == uVar7) {
        uVar7 = 0;
        do {
          if (uVar6 == uVar7) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                          ,0x183,
                          "int Abc_NtkCollectSupergate_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
          }
          ppvVar2 = vSuper->pArray + uVar7;
          uVar7 = uVar7 + 1;
        } while (*ppvVar2 != (void *)((ulong)pNode ^ 1));
        return -1;
      }
      ppvVar2 = vSuper->pArray + uVar7;
      uVar7 = uVar7 + 1;
    } while ((Abc_Obj_t *)*ppvVar2 != pNode);
  }
  return uVar5;
}

Assistant:

int Abc_NtkCollectSupergate_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst, int fStopAtMux )
{
    int RetValue1, RetValue2, i;
    // check if the node is visited
    if ( Abc_ObjRegular(pNode)->fMarkB )
    {
        // check if the node occurs in the same polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == pNode )
                return 1;
        // check if the node is present in the opposite polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == Abc_ObjNot(pNode) )
                return -1;
        assert( 0 );
        return 0;
    }
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst )
        if ( Abc_ObjIsComplement(pNode) || !Abc_ObjIsNode(pNode) || Abc_ObjFanoutNum(pNode) > 1 || (fStopAtMux && Abc_NodeIsMuxType(pNode)) )
        {
            Vec_PtrPush( vSuper, pNode );
            Abc_ObjRegular(pNode)->fMarkB = 1;
            return 0;
        }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    // go through the branches
    RetValue1 = Abc_NtkCollectSupergate_rec( Abc_ObjChild0(pNode), vSuper, 0, fStopAtMux );
    RetValue2 = Abc_NtkCollectSupergate_rec( Abc_ObjChild1(pNode), vSuper, 0, fStopAtMux );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}